

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsCreateExternalArrayBuffer
          (void *data,uint byteLength,JsFinalizeCallback finalizeCallback,void *callbackState,
          JsValueRef *result)

{
  anon_class_40_5_ccb4b9b0 fn;
  JsErrorCode JVar1;
  JsValueRef *local_30;
  JsValueRef *result_local;
  void *callbackState_local;
  JsFinalizeCallback finalizeCallback_local;
  void *pvStack_10;
  uint byteLength_local;
  void *data_local;
  
  fn.byteLength = (uint *)((long)&finalizeCallback_local + 4);
  fn.data = &stack0xfffffffffffffff0;
  fn.result = &local_30;
  fn.finalizeCallback = (JsFinalizeCallback *)&callbackState_local;
  fn.callbackState = &result_local;
  local_30 = result;
  result_local = (JsValueRef *)callbackState;
  callbackState_local = finalizeCallback;
  finalizeCallback_local._4_4_ = byteLength;
  pvStack_10 = data;
  JVar1 = ContextAPINoScriptWrapper<JsCreateExternalArrayBuffer::__0>(fn,false,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsCreateExternalArrayBuffer(_Pre_maybenull_ _Pre_writable_byte_size_(byteLength) void *data, _In_ unsigned int byteLength,
    _In_opt_ JsFinalizeCallback finalizeCallback, _In_opt_ void *callbackState, _Out_ JsValueRef *result)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalArrayBuffer, reinterpret_cast<BYTE*>(data), byteLength);

        PARAM_NOT_NULL(result);

        if (data == nullptr && byteLength > 0)
        {
            return JsErrorInvalidArgument;
        }

        Js::JavascriptLibrary* library = scriptContext->GetLibrary();
        *result = Js::JsrtExternalArrayBuffer::New(
            reinterpret_cast<BYTE*>(data),
            byteLength,
            finalizeCallback,
            callbackState,
            library->GetArrayBufferType());

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(*result));
        return JsNoError;
    });
}